

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void mul64To128(uint64_t a,uint64_t b,uint64_t *z0Ptr,uint64_t *z1Ptr)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t z1;
  uint64_t zMiddleB;
  uint64_t zMiddleA;
  uint64_t z0;
  uint32_t bLow;
  uint32_t bHigh;
  uint32_t aLow;
  uint32_t aHigh;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar1 = (uint)(a >> 0x20);
  uVar2 = (uint)(b >> 0x20);
  uVar3 = (ulong)uVar1 * (b & 0xffffffff);
  uVar4 = uVar3 + (a & 0xffffffff) * (ulong)uVar2;
  uVar5 = (uVar4 << 0x20) + (a & 0xffffffff) * (b & 0xffffffff);
  *z1Ptr = uVar5;
  *z0Ptr = (long)(int)(uint)(uVar5 < uVar4 << 0x20) +
           ((long)(int)(uint)(uVar4 < uVar3) << 0x20) + (uVar4 >> 0x20) +
           (ulong)uVar1 * (ulong)uVar2;
  return;
}

Assistant:

static inline void mul64To128( uint64_t a, uint64_t b, uint64_t *z0Ptr, uint64_t *z1Ptr )
{
    uint32_t aHigh, aLow, bHigh, bLow;
    uint64_t z0, zMiddleA, zMiddleB, z1;

    aLow = a;
    aHigh = a>>32;
    bLow = b;
    bHigh = b>>32;
    z1 = ( (uint64_t) aLow ) * bLow;
    zMiddleA = ( (uint64_t) aLow ) * bHigh;
    zMiddleB = ( (uint64_t) aHigh ) * bLow;
    z0 = ( (uint64_t) aHigh ) * bHigh;
    zMiddleA += zMiddleB;
    z0 += ( ( (uint64_t) ( zMiddleA < zMiddleB ) )<<32 ) + ( zMiddleA>>32 );
    zMiddleA <<= 32;
    z1 += zMiddleA;
    z0 += ( z1 < zMiddleA );
    *z1Ptr = z1;
    *z0Ptr = z0;

}